

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O1

int32_t utrie2_internalU8PrevIndex_63(UTrie2 *trie,UChar32 c,uint8_t *start,uint8_t *src)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint16_t *puVar4;
  uint uVar5;
  long lVar6;
  int32_t i;
  int32_t local_1c;
  
  lVar6 = (long)src - (long)start;
  if (lVar6 < 8) {
    local_1c = (int32_t)lVar6;
  }
  else {
    local_1c = 7;
    start = src + -7;
    lVar6 = 7;
  }
  uVar2 = utf8_prevCharSafeBody_63(start,0,&local_1c,c,-1);
  if (uVar2 < 0xd800) {
    puVar4 = trie->index;
    uVar5 = uVar2 >> 5;
LAB_001bf211:
    uVar1 = puVar4[uVar5];
  }
  else {
    if (uVar2 < 0x10000) {
      uVar5 = (uVar2 >> 5) + 0x140;
      if (0xdbff < (int)uVar2) {
        uVar5 = uVar2 >> 5;
      }
      puVar4 = trie->index;
      goto LAB_001bf211;
    }
    if (0x10ffff < uVar2) {
      iVar3 = 0x80;
      if (trie->data32 == (uint32_t *)0x0) {
        iVar3 = trie->indexLength + 0x80;
      }
      goto LAB_001bf21b;
    }
    if (trie->highStart <= (int)uVar2) {
      iVar3 = trie->highValueIndex;
      goto LAB_001bf21b;
    }
    uVar1 = trie->index[(uVar2 >> 5 & 0x3f) + (uint)trie->index[(ulong)(uVar2 >> 0xb) + 0x820]];
  }
  iVar3 = (uVar2 & 0x1f) + (uint)uVar1 * 4;
LAB_001bf21b:
  return iVar3 << 3 | (int)lVar6 - local_1c;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_internalU8PrevIndex(const UTrie2 *trie, UChar32 c,
                           const uint8_t *start, const uint8_t *src) {
    int32_t i, length;
    /* support 64-bit pointers by avoiding cast of arbitrary difference */
    if((src-start)<=7) {
        i=length=(int32_t)(src-start);
    } else {
        i=length=7;
        start=src-7;
    }
    c=utf8_prevCharSafeBody(start, 0, &i, c, -1);
    i=length-i;  /* number of bytes read backward from src */
    return u8Index(trie, c, i);
}